

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> __thiscall
fmt::v8::detail::digit_grouping<char8_t>::
apply<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char>
          (digit_grouping<char8_t> *this,back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out
          ,basic_string_view<char> digits)

{
  int iVar1;
  type tVar2;
  size_t sVar3;
  int *piVar4;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *pbVar5;
  char *pcVar6;
  next_state nVar7;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_890;
  char local_881;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> local_880;
  char8_t local_875;
  int local_874;
  int local_870;
  int sep_index;
  int i_1;
  int i;
  int local_860;
  undefined1 local_858 [8];
  next_state state;
  allocator<int> local_831;
  undefined1 local_830 [8];
  basic_memory_buffer<int,_500UL,_std::allocator<int>_> separators;
  int num_digits;
  digit_grouping<char8_t> *this_local;
  basic_string_view<char> digits_local;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out_local;
  
  digits_local.data_ = (char *)digits.size_;
  this_local = (digit_grouping<char8_t> *)digits.data_;
  digits_local.size_ = (size_t)out.container;
  sVar3 = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  separators._2036_4_ = SUB84(sVar3,0);
  std::allocator<int>::allocator(&local_831);
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::basic_memory_buffer
            ((basic_memory_buffer<int,_500UL,_std::allocator<int>_> *)local_830,&local_831);
  std::allocator<int>::~allocator(&local_831);
  state.pos = 0;
  buffer<int>::push_back((buffer<int> *)local_830,&state.pos);
  nVar7 = initial_state(this);
  _i_1 = nVar7.group._M_current;
  local_860 = nVar7.pos;
  local_858 = (undefined1  [8])_i_1;
  state.group._M_current._0_4_ = local_860;
  while ((sep_index = next(this,(next_state *)local_858), sep_index != 0 &&
         (sep_index < (int)separators._2036_4_))) {
    buffer<int>::push_back((buffer<int> *)local_830,&sep_index);
  }
  local_870 = 0;
  sVar3 = buffer<int>::size((buffer<int> *)local_830);
  local_874 = (int)sVar3 + -1;
  for (; sVar3 = digits_local.size_, local_870 < (int)separators._2036_4_; local_870 = local_870 + 1
      ) {
    iVar1 = separators._2036_4_ - local_870;
    piVar4 = buffer<int>::operator[]<int>((buffer<int> *)local_830,local_874);
    if (iVar1 == *piVar4) {
      local_875 = separator(this);
      local_880 = std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator++
                            ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *)
                             &digits_local.size_,0);
      pbVar5 = std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator*(&local_880);
      std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator=(pbVar5,&local_875);
      local_874 = local_874 + -1;
    }
    tVar2 = to_unsigned<int>(local_870);
    pcVar6 = basic_string_view<char>::operator[]
                       ((basic_string_view<char> *)&this_local,(ulong)tVar2);
    local_881 = *pcVar6;
    local_890 = std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator++
                          ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *)
                           &digits_local.size_,0);
    pbVar5 = std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator*(&local_890);
    std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>::operator=(pbVar5,&local_881);
  }
  basic_memory_buffer<int,_500UL,_std::allocator<int>_>::~basic_memory_buffer
            ((basic_memory_buffer<int,_500UL,_std::allocator<int>_> *)local_830);
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)(buffer<char8_t> *)sVar3;
}

Assistant:

Out apply(Out out, basic_string_view<C> digits) const {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        *out++ = separator();
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }